

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,Type type)

{
  long in_FS_OFFSET;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->value).n = 0;
  (this->value).container = (QCborContainerPrivate *)0x0;
  (this->value).t = Undefined;
  switch(type) {
  case Null:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Null;
    break;
  case Bool:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = False;
    break;
  case Double:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Double;
    break;
  case String:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = String;
    break;
  case Array:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Array;
    break;
  case Object:
    (this->value).n = 0;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Map;
    break;
  default:
    goto switchD_002f57d5_default;
  }
  local_18 = 0xaaaaaaaa00000117;
  local_20 = 0;
  local_28 = 0;
  local_30 = 0x117;
  uStack_38 = 0;
  local_40 = 0;
  QCborValue::~QCborValue((QCborValue *)&local_28);
  QCborValue::~QCborValue((QCborValue *)&local_40);
switchD_002f57d5_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QJsonValue::QJsonValue(Type type)
{
    switch (type) {
    case Null:
        value = QCborValue::Null;
        break;
    case Bool:
        value = QCborValue::False;
        break;
    case Double:
        value = QCborValue::Double;
        break;
    case String:
        value = QCborValue::String;
        break;
    case Array:
        value = QCborValue::Array;
        break;
    case Object:
        value = QCborValue::Map;
        break;
    case Undefined:
        break;
    }
}